

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CECorrections.cpp
# Opt level: O2

bool __thiscall CECorrections::LoadNutation(CECorrections *this)

{
  vector<int,_std::allocator<int>_> *this_00;
  vector<double,_std::allocator<double>_> *this_01;
  bool bVar1;
  size_type sVar2;
  istream *piVar3;
  vector<double,_std::allocator<double>_> *this_02;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  int mjd;
  vector<double,_std::allocator<double>_> *local_2c0;
  vector<double,_std::allocator<double>_> *local_2b8;
  vector<double,_std::allocator<double>_> *local_2b0;
  double local_2a8;
  double dut1;
  string local_298;
  string url;
  string line;
  ifstream corrections_file;
  
  this_00 = &this->nutation_mjd_;
  sVar2 = std::vector<int,_std::allocator<int>_>::size(this_00);
  if (sVar2 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&url,"http://maia.usno.navy.mil/ser7/finals2000A.all",
               (allocator *)&corrections_file);
    __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&corrections_file);
    LoadFile((CECorrections *)&corrections_file,(string *)this,&this->nutation_file_);
    std::vector<int,_std::allocator<int>_>::reserve(this_00,20000);
    local_2b0 = &this->nutation_dut1_;
    std::vector<double,_std::allocator<double>_>::reserve(local_2b0,20000);
    local_2b8 = &this->nutation_xp_;
    std::vector<double,_std::allocator<double>_>::reserve(local_2b8,20000);
    local_2c0 = &this->nutation_yp_;
    std::vector<double,_std::allocator<double>_>::reserve(local_2c0,20000);
    this_01 = &this->nutation_deps_;
    std::vector<double,_std::allocator<double>_>::reserve(this_01,20000);
    this_02 = &this->nutation_dpsi_;
    std::vector<double,_std::allocator<double>_>::reserve(this_02,20000);
    std::__cxx11::string::string((string *)&line);
    while( true ) {
      piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&corrections_file,(string *)&line);
      bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18)));
      if (!bVar1) break;
      std::__cxx11::string::substr((ulong)&local_298,(ulong)&line);
      mjd = std::__cxx11::stoi(&local_298,(size_t *)0x0,10);
      std::__cxx11::string::~string((string *)&local_298);
      std::__cxx11::string::substr((ulong)&local_298,(ulong)&line);
      dut1 = std::__cxx11::stod(&local_298,(size_t *)0x0);
      std::__cxx11::string::~string((string *)&local_298);
      std::__cxx11::string::substr((ulong)&local_298,(ulong)&line);
      dVar4 = std::__cxx11::stod(&local_298,(size_t *)0x0);
      std::__cxx11::string::~string((string *)&local_298);
      std::__cxx11::string::substr((ulong)&local_298,(ulong)&line);
      dVar5 = std::__cxx11::stod(&local_298,(size_t *)0x0);
      std::__cxx11::string::~string((string *)&local_298);
      std::__cxx11::string::substr((ulong)&local_298,(ulong)&line);
      dVar6 = std::__cxx11::stod(&local_298,(size_t *)0x0);
      std::__cxx11::string::~string((string *)&local_298);
      std::__cxx11::string::substr((ulong)&local_298,(ulong)&line);
      dVar7 = std::__cxx11::stod(&local_298,(size_t *)0x0);
      std::__cxx11::string::~string((string *)&local_298);
      local_2a8 = dVar7;
      std::vector<int,_std::allocator<int>_>::push_back(this_00,&mjd);
      std::vector<double,_std::allocator<double>_>::push_back(local_2b0,&dut1);
      local_298._M_dataplus._M_p = (pointer)(dVar4 * 4.84813681109536e-06);
      std::vector<double,_std::allocator<double>_>::push_back
                (local_2b8,(value_type_conflict *)&local_298);
      local_298._M_dataplus._M_p = (pointer)(dVar5 * 4.84813681109536e-06);
      std::vector<double,_std::allocator<double>_>::push_back
                (local_2c0,(value_type_conflict *)&local_298);
      local_298._M_dataplus._M_p = (pointer)(dVar6 * 4.84813681109536e-09);
      std::vector<double,_std::allocator<double>_>::push_back
                (this_01,(value_type_conflict *)&local_298);
      local_298._M_dataplus._M_p = (pointer)(local_2a8 * 4.84813681109536e-09);
      std::vector<double,_std::allocator<double>_>::push_back
                (this_02,(value_type_conflict *)&local_298);
    }
    std::ifstream::close();
    std::vector<int,_std::allocator<int>_>::shrink_to_fit(this_00);
    std::vector<double,_std::allocator<double>_>::shrink_to_fit(local_2b0);
    std::vector<double,_std::allocator<double>_>::shrink_to_fit(local_2b8);
    std::vector<double,_std::allocator<double>_>::shrink_to_fit(local_2c0);
    std::vector<double,_std::allocator<double>_>::shrink_to_fit(this_01);
    std::vector<double,_std::allocator<double>_>::shrink_to_fit(this_02);
    std::__cxx11::string::~string((string *)&line);
    std::ifstream::~ifstream(&corrections_file);
    std::__cxx11::string::~string((string *)&url);
  }
  return true;
}

Assistant:

bool CECorrections::LoadNutation(void) const
{
    bool loaded = true;
    if (nutation_mjd_.size() == 0) {
        // Check if the file has been stored
        std::string   url = "http://maia.usno.navy.mil/ser7/finals2000A.all";
        std::ifstream corrections_file = LoadFile(nutation_file_, url);

        // Try to load values from the file
        try {
            // Allocate an approximate amount of memory for the values
            nutation_mjd_.reserve(20000);
            nutation_dut1_.reserve(20000);
            nutation_xp_.reserve(20000);
            nutation_yp_.reserve(20000);
            nutation_deps_.reserve(20000);
            nutation_dpsi_.reserve(20000);

            // Preliminary storage values
            int    mjd;
            double dut1;
            double xp;
            double yp;
            double deps;
            double dpsi;

            // Loop through each line of the file
            std::string line;
            while(std::getline(corrections_file, line)) {
                mjd = std::stoi(line.substr(7,8));

                // Try to load dut1, xypolar from bulletin B positions
                try {
                    dut1 = std::stod(line.substr(154,11));
                    xp   = std::stod(line.substr(134,10));
                    yp   = std::stod(line.substr(144,10));
                    deps = std::stod(line.substr(175,10));
                    dpsi = std::stod(line.substr(165,10));
                } 
                // Otherwise load from bulletin A positions
                catch (std::exception& e) {
                    try {
                        dut1 = std::stod(line.substr(58,10));
                        xp   = std::stod(line.substr(18, 9));
                        yp   = std::stod(line.substr(37, 9));
                        deps = std::stod(line.substr(116,9));
                        dpsi = std::stod(line.substr(97,9));
                    }
                    catch (std::exception& e) {
                        // Reached end of useable fields in the file
                        break;
                    }
                }

                // The Standards of Fundamental Astronomy expects angles in 
                // units of radians, so xp, yp, deps, and dpsi need to be converted
                nutation_mjd_.push_back( mjd );
                nutation_dut1_.push_back( dut1 );
                nutation_xp_.push_back( xp * DAS2R );      // arcsec -> radians
                nutation_yp_.push_back( yp * DAS2R );      // arcsec -> radians
                nutation_deps_.push_back( deps * DMAS2R ); // marcsec -> radians
                nutation_dpsi_.push_back( dpsi * DMAS2R ); // marcsec -> radians
            }

            // Close the corrections file
            corrections_file.close();

            // Shrink up the vectors so we dont take more memory than necessary
            nutation_mjd_.shrink_to_fit();
            nutation_dut1_.shrink_to_fit();
            nutation_xp_.shrink_to_fit();
            nutation_yp_.shrink_to_fit();
            nutation_deps_.shrink_to_fit();
            nutation_dpsi_.shrink_to_fit();

        } catch (std::exception& e) {
            std::cerr << "ERROR Unable to load corrections from file" << std::endl;
            std::cerr << e.what() << std::endl;
            loaded = false;
        }
    }
    return loaded;
}